

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

char * uprv_tzname_63(int n)

{
  char *dstID;
  UBool UVar1;
  int32_t offset;
  ssize_t sVar2;
  char *pcVar3;
  DefaultTZInfo *tzInfo_00;
  uint local_ac;
  undefined1 local_a8 [4];
  int daylightType;
  tm decemberSol;
  tm juneSol;
  DefaultTZInfo *tzInfo;
  char *tzZoneInfoTailPtr;
  int32_t tzZoneInfoTailLen;
  int32_t ret;
  char *tzid;
  char *pcStack_10;
  int n_local;
  
  _tzZoneInfoTailLen = (char *)0x0;
  tzid._4_4_ = n;
  _tzZoneInfoTailLen = getenv("TZ");
  if ((_tzZoneInfoTailLen == (char *)0x0) ||
     (UVar1 = isValidOlsonID(_tzZoneInfoTailLen), UVar1 == '\0')) {
    if (gTimeZoneBufferPtr == (char *)0x0) {
      sVar2 = readlink("/etc/localtime",gTimeZoneBuffer,0xfff);
      if ((int)sVar2 < 1) {
        tzInfo_00 = (DefaultTZInfo *)uprv_malloc_63(0x20);
        if (tzInfo_00 != (DefaultTZInfo *)0x0) {
          tzInfo_00->defaultTZBuffer = (char *)0x0;
          tzInfo_00->defaultTZFileSize = 0;
          tzInfo_00->defaultTZFilePtr = (FILE *)0x0;
          tzInfo_00->defaultTZstatus = '\0';
          tzInfo_00->defaultTZPosition = 0;
          gTimeZoneBufferPtr = searchForTZFile("/usr/share/zoneinfo/",tzInfo_00);
          if (tzInfo_00->defaultTZBuffer != (char *)0x0) {
            uprv_free_63(tzInfo_00->defaultTZBuffer);
          }
          if (tzInfo_00->defaultTZFilePtr != (FILE *)0x0) {
            fclose((FILE *)tzInfo_00->defaultTZFilePtr);
          }
          uprv_free_63(tzInfo_00);
        }
        if ((gTimeZoneBufferPtr != (char *)0x0) &&
           (UVar1 = isValidOlsonID(gTimeZoneBufferPtr), UVar1 != '\0')) {
          return gTimeZoneBufferPtr;
        }
      }
      else {
        gTimeZoneBuffer[(int)sVar2] = '\0';
        pcVar3 = strstr(gTimeZoneBuffer,"/zoneinfo/");
        if ((pcVar3 != (char *)0x0) && (UVar1 = isValidOlsonID(pcVar3 + 10), UVar1 != '\0')) {
          gTimeZoneBufferPtr = pcVar3 + 10;
          return pcVar3 + 10;
        }
      }
      localtime_r(&uprv_tzname_63::juneSolstice,(tm *)&decemberSol.tm_zone);
      localtime_r(&uprv_tzname_63::decemberSolstice,(tm *)local_a8);
      dstID = _strcmp;
      pcVar3 = _tzname;
      if (decemberSol.tm_wday < 1) {
        local_ac = (uint)(0 < juneSol.tm_wday);
      }
      else {
        local_ac = 2;
      }
      offset = uprv_timezone_63();
      pcStack_10 = remapShortTimeZone(pcVar3,dstID,local_ac,offset);
      if (pcStack_10 == (char *)0x0) {
        pcStack_10 = *(char **)(&tzname + (long)tzid._4_4_ * 8);
      }
    }
    else {
      pcStack_10 = gTimeZoneBufferPtr;
    }
  }
  else {
    if (*_tzZoneInfoTailLen == ':') {
      _tzZoneInfoTailLen = _tzZoneInfoTailLen + 1;
    }
    skipZoneIDPrefix((char **)&tzZoneInfoTailLen);
    pcStack_10 = _tzZoneInfoTailLen;
  }
  return pcStack_10;
}

Assistant:

U_CAPI const char* U_EXPORT2
uprv_tzname(int n)
{
    (void)n; // Avoid unreferenced parameter warning.
    const char *tzid = NULL;
#if U_PLATFORM_USES_ONLY_WIN32_API
    tzid = uprv_detectWindowsTimeZone();

    if (tzid != NULL) {
        return tzid;
    }

#ifndef U_TZNAME
    // The return value is free'd in timezone.cpp on Windows because
    // the other code path returns a pointer to a heap location.
    // If we don't have a name already, then tzname wouldn't be any
    // better, so just fall back.
    return uprv_strdup("Etc/UTC");
#endif // !U_TZNAME

#else

/*#if U_PLATFORM_IS_DARWIN_BASED
    int ret;

    tzid = getenv("TZFILE");
    if (tzid != NULL) {
        return tzid;
    }
#endif*/

/* This code can be temporarily disabled to test tzname resolution later on. */
#ifndef DEBUG_TZNAME
    tzid = getenv("TZ");
    if (tzid != NULL && isValidOlsonID(tzid)
#if U_PLATFORM == U_PF_SOLARIS
    /* When TZ equals localtime on Solaris, check the /etc/localtime file. */
        && uprv_strcmp(tzid, TZ_ENV_CHECK) != 0
#endif
    ) {
        /* The colon forces tzset() to treat the remainder as zoneinfo path */ 
        if (tzid[0] == ':') { 
            tzid++; 
        } 
        /* This might be a good Olson ID. */
        skipZoneIDPrefix(&tzid);
        return tzid;
    }
    /* else U_TZNAME will give a better result. */
#endif

#if defined(CHECK_LOCALTIME_LINK) && !defined(DEBUG_SKIP_LOCALTIME_LINK)
    /* Caller must handle threading issues */
    if (gTimeZoneBufferPtr == NULL) {
        /*
        This is a trick to look at the name of the link to get the Olson ID
        because the tzfile contents is underspecified.
        This isn't guaranteed to work because it may not be a symlink.
        */
        int32_t ret = (int32_t)readlink(TZDEFAULT, gTimeZoneBuffer, sizeof(gTimeZoneBuffer)-1);
        if (0 < ret) {
            int32_t tzZoneInfoTailLen = uprv_strlen(TZZONEINFOTAIL);
            gTimeZoneBuffer[ret] = 0;
            char *  tzZoneInfoTailPtr = uprv_strstr(gTimeZoneBuffer, TZZONEINFOTAIL);
            
            if (tzZoneInfoTailPtr != NULL
                && isValidOlsonID(tzZoneInfoTailPtr + tzZoneInfoTailLen))
            {
                return (gTimeZoneBufferPtr = tzZoneInfoTailPtr + tzZoneInfoTailLen);
            }
        } else {
#if defined(SEARCH_TZFILE)
            DefaultTZInfo* tzInfo = (DefaultTZInfo*)uprv_malloc(sizeof(DefaultTZInfo));
            if (tzInfo != NULL) {
                tzInfo->defaultTZBuffer = NULL;
                tzInfo->defaultTZFileSize = 0;
                tzInfo->defaultTZFilePtr = NULL;
                tzInfo->defaultTZstatus = FALSE;
                tzInfo->defaultTZPosition = 0;

                gTimeZoneBufferPtr = searchForTZFile(TZZONEINFO, tzInfo);

                /* Free previously allocated memory */
                if (tzInfo->defaultTZBuffer != NULL) {
                    uprv_free(tzInfo->defaultTZBuffer);
                }
                if (tzInfo->defaultTZFilePtr != NULL) {
                    fclose(tzInfo->defaultTZFilePtr);
                }
                uprv_free(tzInfo);
            }

            if (gTimeZoneBufferPtr != NULL && isValidOlsonID(gTimeZoneBufferPtr)) {
                return gTimeZoneBufferPtr;
            }
#endif
        }
    }
    else {
        return gTimeZoneBufferPtr;
    }
#endif
#endif

#ifdef U_TZNAME
#if U_PLATFORM_USES_ONLY_WIN32_API
    /* The return value is free'd in timezone.cpp on Windows because
     * the other code path returns a pointer to a heap location. */
    return uprv_strdup(U_TZNAME[n]);
#else
    /*
    U_TZNAME is usually a non-unique abbreviation, which isn't normally usable.
    So we remap the abbreviation to an olson ID.

    Since Windows exposes a little more timezone information,
    we normally don't use this code on Windows because
    uprv_detectWindowsTimeZone should have already given the correct answer.
    */
    {
        struct tm juneSol, decemberSol;
        int daylightType;
        static const time_t juneSolstice=1182478260; /*2007-06-21 18:11 UT*/
        static const time_t decemberSolstice=1198332540; /*2007-12-22 06:09 UT*/

        /* This probing will tell us when daylight savings occurs.  */
        localtime_r(&juneSolstice, &juneSol);
        localtime_r(&decemberSolstice, &decemberSol);
        if(decemberSol.tm_isdst > 0) {
          daylightType = U_DAYLIGHT_DECEMBER;
        } else if(juneSol.tm_isdst > 0) {
          daylightType = U_DAYLIGHT_JUNE;
        } else {
          daylightType = U_DAYLIGHT_NONE;
        }
        tzid = remapShortTimeZone(U_TZNAME[0], U_TZNAME[1], daylightType, uprv_timezone());
        if (tzid != NULL) {
            return tzid;
        }
    }
    return U_TZNAME[n];
#endif
#else
    return "";
#endif
}